

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

size_t masked_vbyte_read_loop_fromcompressedsize(uint8_t *in,uint32_t *out,size_t inputsize)

{
  byte bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  uint6 uVar4;
  byte bVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong in_RDX;
  int *in_RSI;
  undefined1 (*in_RDI) [32];
  uint8_t c;
  uint32_t v;
  uint shift;
  uint64_t bytes_1;
  uint64_t ints_read_1;
  int newsig;
  uint64_t newsigavx;
  uint64_t bytes;
  uint64_t ints_read;
  uint64_t reload;
  uint64_t remaining;
  uint64_t thisSig;
  uint64_t nextSig;
  uint32_t highSig;
  __m128i high;
  uint32_t lowSig;
  __m256i low;
  size_t scanned;
  int availablebytes;
  uint64_t sig;
  uint32_t *initout;
  size_t consumed;
  int local_1e0;
  long local_1d0;
  long local_1b0;
  ulong local_190;
  long local_140;
  int local_134;
  ulong local_130;
  ulong local_120;
  int *local_110;
  uint64_t *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  
  local_120 = 0;
  local_130 = 0;
  local_134 = 0;
  local_110 = in_RSI;
  if (0x60 < in_RDX) {
    in_stack_ffffffffffffff60 = *(uint64_t *)*in_RDI;
    in_stack_ffffffffffffff68 = *(uint32_t **)(*in_RDI + 8);
    in_stack_ffffffffffffff70 = *(uint8_t **)(*in_RDI + 0x10);
    auVar2 = *in_RDI;
    auVar3 = *(undefined1 (*) [16])in_RDI[1];
    uVar4 = CONCAT24((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)((ulong)*(undefined8 *)(in_RDI[1] + 8) >> 0x3f) << 0xf,
                     (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                     (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                     (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                     (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                     (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                     (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                     (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                     (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                     (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                     (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                     (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                     (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                     (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                     (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                     (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                     (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                     (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                     (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                     (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                     (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                     (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                     (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                     (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                     (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                     (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                     (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                     (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                     (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                     (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                     (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                     (uint)(byte)((ulong)*(undefined8 *)(*in_RDI + 0x18) >> 0x3f) << 0x1f);
    local_140 = 0x30;
    while (local_190 = (ulong)uVar4, local_140 + 0x30U <= in_RDX) {
      in_stack_ffffffffffffff58 = *(uint64_t **)(*(undefined1 (*) [32])(*in_RDI + local_140) + 0x18)
      ;
      auVar2 = *(undefined1 (*) [32])(*in_RDI + local_140);
      auVar3 = *(undefined1 (*) [16])(in_RDI[1] + local_140);
      uVar4 = CONCAT24((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)((ulong)*(undefined8 *)(in_RDI[1] + local_140 + 8) >> 0x3f) <<
                       0xf,(uint)(SUB321(auVar2 >> 7,0) & 1) |
                           (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                           (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                           (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                           (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                           (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                           (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                           (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                           (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                           (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                           (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                           (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                           (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                           (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                           (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                           (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                           (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                           (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                           (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                           (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                           (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                           (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                           (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                           (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                           (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                           (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                           (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                           (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                           (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                           (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                           (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                           (uint)(byte)((ulong)in_stack_ffffffffffffff58 >> 0x3f) << 0x1f);
      local_130 = local_190 << ((char)local_140 - ((char)local_120 + '0') & 0x3fU) | local_130;
      uVar6 = local_140 - 0x10;
      local_140 = local_140 + 0x30;
      for (; local_120 < uVar6; local_120 = uVar7 + local_120) {
        uVar7 = masked_vbyte_read_group
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        local_130 = local_130 >> ((byte)uVar7 & 0x3f);
        if (local_130 == 0xffffffffffffffff) {
          return 0;
        }
        local_110 = local_110 + local_1b0;
      }
    }
    local_134 = (int)local_140 - (int)local_120;
  }
  do {
    if (local_134 < 0x10) {
      if ((long)local_134 + local_120 + 0x1f < in_RDX) {
        local_134 = local_134 + 0x20;
      }
      else {
        if (in_RDX <= (long)local_134 + local_120 + 0xf) {
          do {
            if (in_RDX <= local_120) {
              return (long)local_110 - (long)in_RSI >> 2;
            }
            bVar5 = 0;
            local_1e0 = 0;
            while (local_120 < in_RDX) {
              bVar1 = (*in_RDI)[local_120];
              if ((bVar1 & 0x80) == 0) {
                *local_110 = local_1e0 + ((uint)bVar1 << (bVar5 & 0x1f));
                local_110 = local_110 + 1;
                local_120 = local_120 + 1;
                break;
              }
              local_1e0 = ((bVar1 & 0x7f) << (bVar5 & 0x1f)) + local_1e0;
              bVar5 = bVar5 + 7;
              local_120 = local_120 + 1;
            }
          } while( true );
        }
        vlddqu_avx(*(undefined1 (*) [16])(*in_RDI + local_120 + (long)local_134));
        local_134 = local_134 + 0x10;
      }
    }
    uVar7 = masked_vbyte_read_group
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff58);
    local_120 = uVar7 + local_120;
    local_134 = local_134 - (int)uVar7;
    local_110 = local_110 + local_1d0;
  } while( true );
}

Assistant:

size_t masked_vbyte_read_loop_fromcompressedsize(const uint8_t *in,
                                                 uint32_t *out,
                                                 size_t inputsize) {
  size_t consumed = 0; // number of bytes read
  uint32_t *initout = out;

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < inputsize) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    while (scanned + 48 <= inputsize) { // 96 == 48 + 48 ahead for scanning
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes =
            masked_vbyte_read_group(in + consumed, out, sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        out += ints_read;
      }
    }
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (1) {
    if (availablebytes < 16) {
      if (availablebytes + consumed + 31 < inputsize) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + consumed + 15 < inputsize) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;
    uint64_t bytes =
        masked_vbyte_read_group(in + consumed, out, sig, &ints_read);
    consumed += bytes;
    availablebytes -= bytes;
    sig >>= bytes;
    out += ints_read;
  }
  while (consumed < inputsize) {
    unsigned int shift = 0;
    for (uint32_t v = 0; consumed < inputsize; shift += 7) {
      uint8_t c = in[consumed++];
      if ((c & 128) == 0) {
        out[0] = v + (c << shift);
        ++out;
        break;
      } else {
        v += (c & 127) << shift;
      }
    }
  }
  return out - initout;
}